

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::StoreProperty<char_const*>(cmTarget *this,string *prop,char *value)

{
  cmMakefile *pcVar1;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  __type _Var3;
  bool bVar4;
  ostream *poVar5;
  cmGlobalGenerator *pcVar6;
  cmValue cVar7;
  mapped_type *this_00;
  cmake *pcVar8;
  cmTarget *this_01;
  string *psVar9;
  undefined1 in_R9B;
  string_view str;
  char *value_local;
  allocator<char> local_262;
  allocator<char> local_261;
  cmAlphaNum local_260;
  ostringstream e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [22];
  string reusedFrom;
  undefined1 local_98 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  value_local = value;
  _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  if (_Var3) {
    pcVar1 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"MANUALLY_ADDED_DEPENDENCIES property is read-only\n",
               (allocator<char> *)&local_260);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
  }
  else {
    _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(anonymous_namespace)::propNAME_abi_cxx11_);
    if (_Var3) {
      pcVar1 = ((this->impl)._M_t.
                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"NAME property is read-only\n",(allocator<char> *)&local_260);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
    }
    else {
      _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(anonymous_namespace)::propTYPE_abi_cxx11_);
      if (_Var3) {
        pcVar1 = ((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"TYPE property is read-only\n",(allocator<char> *)&local_260);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
      }
      else {
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propEXPORT_NAME_abi_cxx11_);
        if ((_Var3) &&
           (((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ==
            true)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar5 = std::operator<<((ostream *)&e,
                                   "EXPORT_NAME property can\'t be set on imported targets (\"");
          poVar5 = std::operator<<(poVar5,(string *)
                                          &((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->Name);
          std::operator<<(poVar5,"\")\n");
          pcVar1 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&local_260);
LAB_002942c3:
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          return;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propSOURCES_abi_cxx11_);
        if ((_Var3) &&
           (((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ==
            true)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar5 = std::operator<<((ostream *)&e,
                                   "SOURCES property can\'t be set on imported targets (\"");
          poVar5 = std::operator<<(poVar5,(string *)
                                          &((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->Name);
          std::operator<<(poVar5,"\")\n");
          pcVar1 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&local_260);
          goto LAB_002942c3;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
        if ((_Var3) &&
           (((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ==
            false)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar5 = std::operator<<((ostream *)&e,
                                   "IMPORTED_GLOBAL property can\'t be set on non-imported targets (\""
                                  );
          poVar5 = std::operator<<(poVar5,(string *)
                                          &((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->Name);
          std::operator<<(poVar5,"\")\n");
          pcVar1 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&local_260);
          goto LAB_002942c3;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_);
        if (_Var3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                   IncludeDirectoriesEntries);
          if (value == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace((cmMakefile *)&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      IncludeDirectoriesEntries,&value_local,(cmListFileBacktrace *)&e);
LAB_0029464e:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_228);
          return;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_);
        if (_Var3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                   CompileOptionsEntries);
          if (value == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace((cmMakefile *)&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileOptionsEntries,&value_local,(cmListFileBacktrace *)&e);
          goto LAB_0029464e;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_);
        if (_Var3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                   CompileFeaturesEntries);
          if (value == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace((cmMakefile *)&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileFeaturesEntries,&value_local,(cmListFileBacktrace *)&e);
          goto LAB_0029464e;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_);
        if (_Var3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                   CompileDefinitionsEntries);
          if (value == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace((cmMakefile *)&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileDefinitionsEntries,&value_local,(cmListFileBacktrace *)&e);
          goto LAB_0029464e;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_);
        if (_Var3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                   LinkOptionsEntries);
          if (value == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace((cmMakefile *)&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkOptionsEntries,&value_local,(cmListFileBacktrace *)&e);
          goto LAB_0029464e;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_);
        if (_Var3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                   LinkDirectoriesEntries);
          if (value == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace((cmMakefile *)&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkDirectoriesEntries,&value_local,(cmListFileBacktrace *)&e);
          goto LAB_0029464e;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_);
        if (_Var3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                   PrecompileHeadersEntries);
          if (value == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace((cmMakefile *)&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      PrecompileHeadersEntries,&value_local,(cmListFileBacktrace *)&e);
          goto LAB_0029464e;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
        if (_Var3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                   LinkImplementationPropertyEntries);
          if (value == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace((cmMakefile *)&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkImplementationPropertyEntries,&value_local,(cmListFileBacktrace *)&e);
          goto LAB_0029464e;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::
                                        propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
        if (_Var3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                   LinkInterfacePropertyEntries);
          if (value == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace((cmMakefile *)&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkInterfacePropertyEntries,&value_local,(cmListFileBacktrace *)&e);
          goto LAB_0029464e;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::
                                        propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
        if (_Var3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                   LinkInterfaceDirectPropertyEntries);
          if (value == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace((cmMakefile *)&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkInterfaceDirectPropertyEntries,&value_local,(cmListFileBacktrace *)&e);
          goto LAB_0029464e;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::
                                        propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
        if (_Var3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                   LinkInterfaceDirectExcludePropertyEntries);
          if (value == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace((cmMakefile *)&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkInterfaceDirectExcludePropertyEntries,&value_local,
                     (cmListFileBacktrace *)&e);
          goto LAB_0029464e;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propSOURCES_abi_cxx11_);
        if (_Var3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->SourceEntries)
          ;
          if (value == (char *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace((cmMakefile *)&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      SourceEntries,&value_local,(cmListFileBacktrace *)&e);
          goto LAB_0029464e;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
        if (_Var3) {
          bVar4 = cmValue::IsOn(value);
          if (bVar4) {
            _Var2._M_head_impl =
                 (this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            if ((_Var2._M_head_impl)->ImportedGloballyVisible != false) {
              return;
            }
            (_Var2._M_head_impl)->ImportedGloballyVisible = true;
            pcVar6 = GetGlobalGenerator(this);
            cmGlobalGenerator::IndexTarget(pcVar6,this);
            return;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar5 = std::operator<<((ostream *)&e,
                                   "IMPORTED_GLOBAL property can\'t be set to FALSE on targets (\"")
          ;
          poVar5 = std::operator<<(poVar5,(string *)
                                          &((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->Name);
          std::operator<<(poVar5,"\")\n");
          pcVar1 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&local_260);
          goto LAB_002942c3;
        }
        str._M_str = (prop->_M_dataplus)._M_p;
        str._M_len = prop->_M_string_length;
        bVar4 = cmHasLiteralPrefix<17ul>(str,(char (*) [17])"IMPORTED_LIBNAME");
        if (bVar4) {
          _Var2._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          if (value == (char *)0x0) {
            _e = (pointer)local_220;
            local_228._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_220[0]._M_local_buf[0] = '\0';
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>((string *)&e,value,&local_261);
          }
          bVar4 = cmTargetInternals::CheckImportedLibName(_Var2._M_head_impl,prop,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          if (!bVar4) {
            return;
          }
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::propCUDA_PTX_COMPILATION_abi_cxx11_);
        if ((_Var3) &&
           (((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 4)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar5 = std::operator<<((ostream *)&e,
                                   "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\""
                                  );
          poVar5 = std::operator<<(poVar5,(string *)
                                          &((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->Name);
          std::operator<<(poVar5,"\")\n");
          pcVar1 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&local_260);
          goto LAB_002942c3;
        }
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::
                                        propPRECOMPILE_HEADERS_REUSE_FROM_abi_cxx11_);
        if (!_Var3) {
          _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
          if ((((!_Var3) &&
               (_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_),
               !_Var3)) &&
              (_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_),
              !_Var3)) &&
             (((_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_),
               !_Var3 && (_Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propOBJC_STANDARD_abi_cxx11_), !_Var3)) &&
              (_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_
                                      ), !_Var3)))) {
            _Var2._M_head_impl =
                 (this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            bVar4 = (anonymous_namespace)::FileSetType::WriteProperties<char_const*>
                              ((FileSetType *)&(_Var2._M_head_impl)->HeadersFileSets,this,
                               _Var2._M_head_impl,prop,value_local,(bool)in_R9B);
            if (bVar4) {
              return;
            }
            _Var2._M_head_impl =
                 (this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            bVar4 = (anonymous_namespace)::FileSetType::WriteProperties<char_const*>
                              ((FileSetType *)&(_Var2._M_head_impl)->CxxModulesFileSets,this,
                               _Var2._M_head_impl,prop,value_local,(bool)in_R9B);
            if (bVar4) {
              return;
            }
            _Var2._M_head_impl =
                 (this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            bVar4 = (anonymous_namespace)::FileSetType::WriteProperties<char_const*>
                              ((FileSetType *)&(_Var2._M_head_impl)->CxxModuleHeadersFileSets,this,
                               _Var2._M_head_impl,prop,value_local,(bool)in_R9B);
            if (bVar4) {
              return;
            }
            cmPropertyMap::SetProperty
                      (&((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                        Properties,prop,value_local);
            return;
          }
          if (value_local == (char *)0x0) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::erase(&(((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                     LanguageStandardProperties)._M_t,prop);
            return;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_98 + 0x10),value_local,(allocator<char> *)&local_260);
          cmMakefile::GetBacktrace((cmMakefile *)local_98);
          BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BTs
                    ((BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_98 + 0x10),(cmListFileBacktrace *)local_98);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator[](&((this->impl)._M_t.
                                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                  ->LanguageStandardProperties,prop);
          BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator=(this_00,(BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&e);
          BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          ~BTs((BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&e);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
          psVar9 = (string *)(local_98 + 0x10);
          goto LAB_0029406d;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"PRECOMPILE_HEADERS",(allocator<char> *)&local_260);
        cVar7 = GetProperty(this,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        if (cVar7.Value != (string *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar5 = std::operator<<((ostream *)&e,
                                   "PRECOMPILE_HEADERS property is already set on target (\"");
          poVar5 = std::operator<<(poVar5,(string *)
                                          &((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->Name);
          std::operator<<(poVar5,"\")\n");
          pcVar1 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&local_260);
          goto LAB_002942c3;
        }
        pcVar8 = cmMakefile::GetCMakeInstance
                           (((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            Makefile);
        pcVar6 = (pcVar8->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,value_local,(allocator<char> *)&local_260);
        this_01 = cmGlobalGenerator::FindTarget(pcVar6,(string *)&e,false);
        std::__cxx11::string::~string((string *)&e);
        if (this_01 != (cmTarget *)0x0) {
          psVar9 = GetSafeProperty(this_01,prop);
          std::__cxx11::string::string((string *)&reusedFrom,(string *)psVar9);
          if (reusedFrom._M_string_length == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,value_local,(allocator<char> *)&local_260);
            std::__cxx11::string::operator=((string *)&reusedFrom,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
          }
          cmPropertyMap::SetProperty
                    (&((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Properties,
                     prop,&reusedFrom);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"COMPILE_PDB_NAME",(allocator<char> *)&local_260);
          StoreProperty<cmValue>(this_01,(string *)&e,&reusedFrom);
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_98 + 0x50),"COMPILE_PDB_OUTPUT_DIRECTORY",&local_262);
          _e = (pointer)reusedFrom._M_string_length;
          local_228._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)reusedFrom._M_dataplus._M_p;
          local_260.View_._M_len = 5;
          local_260.View_._M_str = ".dir/";
          cmStrCat<>((string *)(local_98 + 0x30),(cmAlphaNum *)&e,&local_260);
          StoreProperty<cmValue>(this_01,(string *)(local_98 + 0x50),(string *)(local_98 + 0x30));
          std::__cxx11::string::~string((string *)(local_98 + 0x30));
          std::__cxx11::string::~string((string *)(local_98 + 0x50));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"COMPILE_PDB_NAME",(allocator<char> *)&local_260);
          cVar7 = GetProperty(this_01,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"COMPILE_PDB_NAME",(allocator<char> *)&local_260);
          StoreProperty<cmValue>(this,(string *)&e,cVar7);
          std::__cxx11::string::~string((string *)&e);
          AddUtility(this,&reusedFrom,false,
                     ((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          psVar9 = &reusedFrom;
          goto LAB_0029406d;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"PRECOMPILE_HEADERS_REUSE_FROM set with non existing target",
                   (allocator<char> *)&local_260);
        cmMakefile::IssueMessage
                  (((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile,
                   FATAL_ERROR,(string *)&e);
      }
    }
  }
  psVar9 = (string *)&e;
LAB_0029406d:
  std::__cxx11::string::~string((string *)psVar9);
  return;
}

Assistant:

void cmTarget::StoreProperty(const std::string& prop, ValueType value)
{
  if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
    this->impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "MANUALLY_ADDED_DEPENDENCIES property is read-only\n");
    return;
  }
  if (prop == propNAME) {
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                       "NAME property is read-only\n");
    return;
  }
  if (prop == propTYPE) {
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                       "TYPE property is read-only\n");
    return;
  }
  if (prop == propEXPORT_NAME && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propSOURCES && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propIMPORTED_GLOBAL && !this->IsImported()) {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be set on non-imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (prop == propINCLUDE_DIRECTORIES) {
    this->impl->IncludeDirectoriesEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->IncludeDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    this->impl->CompileOptionsEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->CompileOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_FEATURES) {
    this->impl->CompileFeaturesEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->CompileFeaturesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    this->impl->CompileDefinitionsEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->CompileDefinitionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propLINK_OPTIONS) {
    this->impl->LinkOptionsEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propLINK_DIRECTORIES) {
    this->impl->LinkDirectoriesEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propPRECOMPILE_HEADERS) {
    this->impl->PrecompileHeadersEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->PrecompileHeadersEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propLINK_LIBRARIES) {
    this->impl->LinkImplementationPropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkImplementationPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES) {
    this->impl->LinkInterfacePropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkInterfacePropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT) {
    this->impl->LinkInterfaceDirectPropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkInterfaceDirectPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE) {
    this->impl->LinkInterfaceDirectExcludePropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkInterfaceDirectExcludePropertyEntries.emplace_back(value,
                                                                         lfbt);
    }
  } else if (prop == propSOURCES) {
    this->impl->SourceEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->SourceEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propIMPORTED_GLOBAL) {
    if (!cmIsOn(value)) {
      std::ostringstream e;
      e << "IMPORTED_GLOBAL property can't be set to FALSE on targets (\""
        << this->impl->Name << "\")\n";
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    /* no need to change anything if value does not change */
    if (!this->impl->ImportedGloballyVisible) {
      this->impl->ImportedGloballyVisible = true;
      this->GetGlobalGenerator()->IndexTarget(this);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !this->impl->CheckImportedLibName(
               prop,
               value ? value
                     : std::string{})) { // NOLINT(bugprone-branch-clone)
    /* error was reported by check method */
  } else if (prop == propCUDA_PTX_COMPILATION &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  } else if (prop == propPRECOMPILE_HEADERS_REUSE_FROM) {
    if (this->GetProperty("PRECOMPILE_HEADERS")) {
      std::ostringstream e;
      e << "PRECOMPILE_HEADERS property is already set on target (\""
        << this->impl->Name << "\")\n";
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    auto* reusedTarget = this->impl->Makefile->GetCMakeInstance()
                           ->GetGlobalGenerator()
                           ->FindTarget(value);
    if (!reusedTarget) {
      const std::string e(
        "PRECOMPILE_HEADERS_REUSE_FROM set with non existing target");
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
      return;
    }

    std::string reusedFrom = reusedTarget->GetSafeProperty(prop);
    if (reusedFrom.empty()) {
      reusedFrom = ConvertToString(value);
    }

    this->impl->Properties.SetProperty(prop, reusedFrom);

    reusedTarget->SetProperty("COMPILE_PDB_NAME", reusedFrom);
    reusedTarget->SetProperty("COMPILE_PDB_OUTPUT_DIRECTORY",
                              cmStrCat(reusedFrom, ".dir/"));

    cmValue tmp = reusedTarget->GetProperty("COMPILE_PDB_NAME");
    this->SetProperty("COMPILE_PDB_NAME", tmp);
    this->AddUtility(reusedFrom, false, this->impl->Makefile);
  } else if (prop == propC_STANDARD || prop == propCXX_STANDARD ||
             prop == propCUDA_STANDARD || prop == propHIP_STANDARD ||
             prop == propOBJC_STANDARD || prop == propOBJCXX_STANDARD) {
    if (value) {
      this->impl->LanguageStandardProperties[prop] =
        BTs<std::string>(value, this->impl->Makefile->GetBacktrace());
    } else {
      this->impl->LanguageStandardProperties.erase(prop);
    }
  } else if (this->impl->HeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value, true)) {
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModulesFileSets.WriteProperties(
               this, this->impl.get(), prop, value, true)) {
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModuleHeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value, true)) {
    /* Handled in the `if` condition. */
  } else {
    this->impl->Properties.SetProperty(prop, value);
  }
}